

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_IAB.cpp
# Opt level: O0

MXFWriter * __thiscall AS_02::IAB::MXFWriter::Finalize(MXFWriter *this)

{
  bool bVar1;
  h__Writer *phVar2;
  ILogSink *this_00;
  int64_t iVar3;
  RuntimeError *pRVar4;
  MXFWriter *in_RSI;
  RuntimeError e;
  Result_t local_188 [104];
  Result_t local_120 [111];
  byte local_b1;
  ulonglong uStack_b0;
  bool check;
  ui64_t size;
  byte_t clip_buffer [8];
  ui64_t current_position;
  MXFWriter *this_local;
  Result_t *result;
  
  phVar2 = ASDCP::mem_ptr<AS_02::IAB::MXFWriter::h__Writer>::operator->(&in_RSI->m_Writer);
  if (phVar2->m_State == ST_BEGIN) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else {
    phVar2 = ASDCP::mem_ptr<AS_02::IAB::MXFWriter::h__Writer>::operator->(&in_RSI->m_Writer);
    if (phVar2->m_State == ST_RUNNING) {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      phVar2 = ASDCP::mem_ptr<AS_02::IAB::MXFWriter::h__Writer>::operator->(&in_RSI->m_Writer);
      iVar3 = Kumu::IFileReader::TellPosition
                        ((IFileReader *)
                         &(phVar2->super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                          super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_File);
      phVar2 = ASDCP::mem_ptr<AS_02::IAB::MXFWriter::h__Writer>::operator->(&in_RSI->m_Writer);
      Kumu::FileReader::Seek
                (clip_buffer,
                 &(phVar2->super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                  super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_File,in_RSI->m_ClipStart + 0x10,0)
      ;
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)clip_buffer);
      Kumu::Result_t::~Result_t((Result_t *)clip_buffer);
      size = 0;
      phVar2 = ASDCP::mem_ptr<AS_02::IAB::MXFWriter::h__Writer>::operator->(&in_RSI->m_Writer);
      uStack_b0 = (phVar2->super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                  super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_StreamOffset - 0x18;
      local_b1 = Kumu::write_BER((uchar *)&size,uStack_b0,8);
      local_b1 = local_b1 & 1;
      if (local_b1 == 0) {
        pRVar4 = (RuntimeError *)__cxa_allocate_exception(0x78);
        Kumu::RuntimeError::RuntimeError(pRVar4,(Result_t *)Kumu::RESULT_FAIL);
        __cxa_throw(pRVar4,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
      }
      phVar2 = ASDCP::mem_ptr<AS_02::IAB::MXFWriter::h__Writer>::operator->(&in_RSI->m_Writer);
      Kumu::FileWriter::Write((uchar *)local_120,(int)phVar2 + 0x10,(uint *)&size);
      Kumu::Result_t::operator=((Result_t *)this,local_120);
      Kumu::Result_t::~Result_t(local_120);
      bVar1 = Kumu::Result_t::Failure((Result_t *)this);
      if (bVar1) {
        pRVar4 = (RuntimeError *)__cxa_allocate_exception(0x78);
        Kumu::RuntimeError::RuntimeError(pRVar4,(Result_t *)this);
        __cxa_throw(pRVar4,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
      }
      phVar2 = ASDCP::mem_ptr<AS_02::IAB::MXFWriter::h__Writer>::operator->(&in_RSI->m_Writer);
      Kumu::FileReader::Seek
                (local_188,
                 &(phVar2->super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                  super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_File,iVar3,0);
      Kumu::Result_t::operator=((Result_t *)this,local_188);
      Kumu::Result_t::~Result_t(local_188);
      bVar1 = Kumu::Result_t::Failure((Result_t *)this);
      if (bVar1) {
        pRVar4 = (RuntimeError *)__cxa_allocate_exception(0x78);
        Kumu::RuntimeError::RuntimeError(pRVar4,(Result_t *)this);
        __cxa_throw(pRVar4,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
      }
      ASDCP::mem_ptr<AS_02::IAB::MXFWriter::h__Writer>::operator->(&in_RSI->m_Writer);
      h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::WriteAS02Footer
                ((h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *)&e.field_0x70);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&e.field_0x70);
      Kumu::Result_t::~Result_t((Result_t *)&e.field_0x70);
      bVar1 = Kumu::Result_t::Failure((Result_t *)this);
      if (bVar1) {
        pRVar4 = (RuntimeError *)__cxa_allocate_exception(0x78);
        Kumu::RuntimeError::RuntimeError(pRVar4,(Result_t *)this);
        __cxa_throw(pRVar4,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
      }
      Reset(in_RSI);
    }
    else {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error
                (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_IAB.cpp"
                 ,0x137);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
    }
  }
  return this;
}

Assistant:

Result_t
AS_02::IAB::MXFWriter::Finalize() {

  /* are we running */

  if (this->m_Writer->m_State == ST_BEGIN) {
    return Kumu::RESULT_INIT;
  }
  if (this->m_Writer->m_State != ST_RUNNING) {
    KM_RESULT_STATE_HERE();
    return RESULT_STATE;
  }


  Result_t result = RESULT_OK;

  try {

    /* write clip length */

    ui64_t current_position = this->m_Writer->m_File.TellPosition();

    result = this->m_Writer->m_File.Seek(m_ClipStart + ASDCP::SMPTE_UL_LENGTH);

    byte_t clip_buffer[CLIP_BER_LENGTH_SIZE] = { 0 };

    ui64_t size = static_cast<ui64_t>(this->m_Writer->m_StreamOffset) /* total size of the KLV */ - RESERVED_KL_SIZE;

    bool check = Kumu::write_BER(clip_buffer, size, CLIP_BER_LENGTH_SIZE);

    if (!check) {
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    result = this->m_Writer->m_File.Write(clip_buffer, CLIP_BER_LENGTH_SIZE);

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

    result = this->m_Writer->m_File.Seek(current_position);

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

    /* write footer */

    result = this->m_Writer->WriteAS02Footer();

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

  } catch (Kumu::RuntimeError e) {

    /* nothing to do since we are about to reset */

    result = e.GetResult();

  }

  /* we are ready to start again */

  this->Reset();

  return result;
}